

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void Curl_pollset_set(Curl_easy *data,easy_pollset *ps,curl_socket_t sock,_Bool do_in,_Bool do_out)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  
  Curl_pollset_change((Curl_easy *)(ulong)!do_out,ps,sock,
                      (int)CONCAT71(in_register_00000009,do_in) +
                      (int)CONCAT71(in_register_00000081,do_out) * 2,
                      (uint)!do_in + (uint)!do_out * 2);
  return;
}

Assistant:

void Curl_pollset_set(struct Curl_easy *data,
                      struct easy_pollset *ps, curl_socket_t sock,
                      bool do_in, bool do_out)
{
  Curl_pollset_change(data, ps, sock,
                      (do_in ? CURL_POLL_IN : 0)|
                      (do_out ? CURL_POLL_OUT : 0),
                      (!do_in ? CURL_POLL_IN : 0)|
                      (!do_out ? CURL_POLL_OUT : 0));
}